

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSender.h
# Opt level: O2

void __thiscall jaegertracing::ThriftSender::~ThriftSender(ThriftSender *this)

{
  *(code **)this = std::__cxx11::string::assign;
  (*_close)();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x90));
  std::
  unique_ptr<apache::thrift::protocol::TProtocolFactory,_std::default_delete<apache::thrift::protocol::TProtocolFactory>_>
  ::~unique_ptr((unique_ptr<apache::thrift::protocol::TProtocolFactory,_std::default_delete<apache::thrift::protocol::TProtocolFactory>_>
                 *)(this + 0x80));
  jaegertracing::thrift::Process::~Process((Process *)(this + 0x30));
  std::vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_>::~vector
            ((vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_> *)
             (this + 0x18));
  std::
  unique_ptr<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
  ::~unique_ptr((unique_ptr<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
                 *)(this + 8));
  return;
}

Assistant:

~ThriftSender() { close(); }